

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variance_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_151d8d0::
MainTestClass<unsigned_int_(*)(const_unsigned_char_*,_int,_const_unsigned_char_*,_int,_unsigned_int_*)>
::OneQuarterTest(MainTestClass<unsigned_int_(*)(const_unsigned_char_*,_int,_const_unsigned_char_*,_int,_unsigned_int_*)>
                 *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  Type type;
  AssertHelper *this_00;
  MainTestClass<unsigned_int_(*)(const_unsigned_char_*,_int,_const_unsigned_char_*,_int,_unsigned_int_*)>
  *in_RDI;
  AssertionResult gtest_ar;
  RegisterStateCheckMMX reg_check_mmx;
  RegisterStateCheck reg_check;
  uint expected;
  uint var;
  uint sse;
  int half;
  uint *in_stack_ffffffffffffff40;
  uint *lhs;
  undefined4 in_stack_ffffffffffffff50;
  uint8_t *puVar4;
  _func_uint_uchar_ptr_int_uchar_ptr_int_uint_ptr *file;
  AssertHelper *in_stack_ffffffffffffff70;
  AssertionResult local_58;
  Message *in_stack_ffffffffffffffb8;
  AssertHelper *in_stack_ffffffffffffffc0;
  RegisterStateCheckMMX local_36;
  int local_18;
  Type local_14;
  uint local_10;
  int local_c;
  
  local_c = block_size(in_RDI);
  local_c = local_c / 2;
  bVar1 = use_high_bit_depth(in_RDI);
  if (bVar1) {
    in_stack_ffffffffffffff70 = (AssertHelper *)((long)in_RDI->src_ << 1);
    iVar2 = byte_shift(in_RDI);
    iVar3 = block_size(in_RDI);
    aom_memset16(in_stack_ffffffffffffff70,0xff << ((byte)iVar2 & 0x1f),(long)iVar3);
    puVar4 = in_RDI->ref_;
    iVar2 = byte_shift(in_RDI);
    aom_memset16((void *)((long)puVar4 << 1),0xff << ((byte)iVar2 & 0x1f),(long)local_c);
    aom_memset16((void *)((long)in_RDI->ref_ * 2 + (long)local_c * 2),0,(long)local_c);
  }
  else {
    puVar4 = in_RDI->src_;
    iVar2 = block_size(in_RDI);
    memset(puVar4,0xff,(long)iVar2);
    memset(in_RDI->ref_,0xff,(long)local_c);
    memset(in_RDI->ref_ + local_c,0,(long)local_c);
  }
  libaom_test::RegisterStateCheckMMX::RegisterStateCheckMMX(&local_36);
  lhs = (uint *)in_RDI->src_;
  file = (in_RDI->params_).func;
  iVar2 = width(in_RDI);
  puVar4 = in_RDI->ref_;
  iVar3 = width(in_RDI);
  type = (*file)((uchar *)lhs,iVar2,puVar4,iVar3,&local_10);
  local_14 = type;
  libaom_test::RegisterStateCheckMMX::~RegisterStateCheckMMX((RegisterStateCheckMMX *)0xcb7d0d);
  iVar3 = block_size(in_RDI);
  local_18 = (iVar3 * 0xfe01) / 4;
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
            ((char *)puVar4,(char *)CONCAT44(iVar2,in_stack_ffffffffffffff50),lhs,
             in_stack_ffffffffffffff40);
  iVar3 = (int)((ulong)puVar4 >> 0x20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_58);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffff70);
    this_00 = (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0xcb7dab)
    ;
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffff70,type,(char *)file,iVar3,
               (char *)CONCAT44(iVar2,in_stack_ffffffffffffff50));
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    testing::internal::AssertHelper::~AssertHelper(this_00);
    testing::Message::~Message((Message *)0xcb7df9);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xcb7e5b);
  return;
}

Assistant:

void MainTestClass<VarianceFunctionType>::OneQuarterTest() {
  const int half = block_size() / 2;
  if (!use_high_bit_depth()) {
    memset(src_, 255, block_size());
    memset(ref_, 255, half);
    memset(ref_ + half, 0, half);
  } else {
    aom_memset16(CONVERT_TO_SHORTPTR(src_), 255 << byte_shift(), block_size());
    aom_memset16(CONVERT_TO_SHORTPTR(ref_), 255 << byte_shift(), half);
    aom_memset16(CONVERT_TO_SHORTPTR(ref_) + half, 0, half);
  }
  unsigned int sse, var, expected;
  API_REGISTER_STATE_CHECK(
      var = params_.func(src_, width(), ref_, width(), &sse));
  expected = block_size() * 255 * 255 / 4;
  EXPECT_EQ(expected, var);
}